

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int lj_cf_string_dump(lua_State *L)

{
  uint64_t uVar1;
  TValue *pTVar2;
  int iVar3;
  GCfunc *pGVar4;
  undefined8 *data;
  GCstr *pGVar5;
  bool local_b9;
  SBuf *sb;
  int strip;
  GCfunc *fn;
  lua_State *L_local;
  SBuf *sb_1;
  
  pGVar4 = lj_lib_checkfunc(L,1);
  local_b9 = false;
  if (L->base + 1 < L->top) {
    local_b9 = (uint)((int)L->base[1].field_4.it >> 0xf) < 0xfffffffe;
  }
  uVar1 = (L->glref).ptr64;
  data = (undefined8 *)(uVar1 + 200);
  *(lua_State **)(uVar1 + 0xe0) = L;
  *data = *(undefined8 *)(uVar1 + 0xd8);
  L->top = L->base + 1;
  if ((pGVar4->c).ffid == '\0') {
    iVar3 = lj_bcwrite(L,(GCproto *)((pGVar4->c).pc.ptr64 - 0x68),writer_buf,data,(uint)local_b9);
    if (iVar3 == 0) {
      pTVar2 = L->top;
      pGVar5 = lj_str_new(L,*(char **)(uVar1 + 0xd8),
                          (ulong)(uint)((int)*data - (int)*(undefined8 *)(uVar1 + 0xd8)));
      pTVar2[-1].u64 = (ulong)pGVar5 | 0xfffd800000000000;
      if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
        lj_gc_step(L);
      }
      return 1;
    }
  }
  lj_err_caller(L,LJ_ERR_STRDUMP);
}

Assistant:

LJLIB_CF(string_dump)
{
  GCfunc *fn = lj_lib_checkfunc(L, 1);
  int strip = L->base+1 < L->top && tvistruecond(L->base+1);
  SBuf *sb = lj_buf_tmp_(L);  /* Assumes lj_bcwrite() doesn't use tmpbuf. */
  L->top = L->base+1;
  if (!isluafunc(fn) || lj_bcwrite(L, funcproto(fn), writer_buf, sb, strip))
    lj_err_caller(L, LJ_ERR_STRDUMP);
  setstrV(L, L->top-1, lj_buf_str(L, sb));
  lj_gc_check(L);
  return 1;
}